

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iarchive_std_suite.cpp
# Opt level: O1

void compact_array_suite::test_int16(void)

{
  array<short,_4UL> value;
  value_type input [10];
  iarchive in;
  undefined4 local_c4;
  array<short,_4UL> local_c0;
  uchar local_b8 [16];
  iarchive local_a8;
  
  local_b8[0] = 0xaa;
  local_b8[1] = '\b';
  local_b8[2] = '\x01';
  local_b8[3] = '\x11';
  local_b8[4] = '\x02';
  local_b8[5] = '\x12';
  local_b8[6] = '\x03';
  local_b8[7] = '\x13';
  local_b8[8] = '\x04';
  local_b8[9] = '\x14';
  trial::protocol::bintoken::iarchive::iarchive<unsigned_char[10]>
            (&local_a8,(uchar (*) [10])local_b8);
  local_c0._M_elems[0] = 0x7fff;
  local_c0._M_elems[1] = 0x7fff;
  local_c0._M_elems[2] = 0x7fff;
  local_c0._M_elems[3] = 0x7fff;
  trial::protocol::serialization::
  load_overloader<trial::protocol::bintoken::iarchive,_std::array<short,_4UL>,_void>::load
            (&local_a8,&local_c0,0);
  local_c4 = 0x1101;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,short,int>
            ("value[0]","INT16_C(0x1101)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_std_suite.cpp"
             ,0x79,"void compact_array_suite::test_int16()",&local_c0,&local_c4);
  local_c4 = 0x1202;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,short,int>
            ("value[1]","INT16_C(0x1202)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_std_suite.cpp"
             ,0x7a,"void compact_array_suite::test_int16()",local_c0._M_elems + 1,&local_c4);
  local_c4 = 0x1303;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,short,int>
            ("value[2]","INT16_C(0x1303)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_std_suite.cpp"
             ,0x7b,"void compact_array_suite::test_int16()",local_c0._M_elems + 2,&local_c4);
  local_c4 = 0x1404;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,short,int>
            ("value[3]","INT16_C(0x1404)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_std_suite.cpp"
             ,0x7c,"void compact_array_suite::test_int16()",local_c0._M_elems + 3,&local_c4);
  local_a8.super_common_iarchive<trial::protocol::bintoken::iarchive>._0_8_ = &PTR_vload_001297c8;
  std::
  _Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
  ::~_Deque_base((_Deque_base<trial::protocol::bintoken::token::code::value,_std::allocator<trial::protocol::bintoken::token::code::value>_>
                  *)((long)&local_a8 + 0x50));
  boost::archive::detail::basic_iarchive::~basic_iarchive((basic_iarchive *)&local_a8);
  return;
}

Assistant:

void test_int16()
{
    const value_type input[] = { token::code::array8_int16, 4 * token::int16::size,
                                 0x01, 0x11,
                                 0x02, 0x12,
                                 0x03, 0x13,
                                 0x04, 0x14 };
    format::iarchive in(input);
    std::array<std::int16_t, 4> value = {{ std::numeric_limits<std::int16_t>::max(),
                                           std::numeric_limits<std::int16_t>::max(),
                                           std::numeric_limits<std::int16_t>::max(),
                                           std::numeric_limits<std::int16_t>::max() }};
    TRIAL_PROTOCOL_TEST_NO_THROW(in >> value);
    TRIAL_PROTOCOL_TEST_EQUAL(value[0], INT16_C(0x1101));
    TRIAL_PROTOCOL_TEST_EQUAL(value[1], INT16_C(0x1202));
    TRIAL_PROTOCOL_TEST_EQUAL(value[2], INT16_C(0x1303));
    TRIAL_PROTOCOL_TEST_EQUAL(value[3], INT16_C(0x1404));
}